

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

double absl::lts_20250127::anon_unknown_0::FloatTraits<double>::Make
                 (mantissa_t mantissa,int exponent,bool sign)

{
  double dVar1;
  unsigned_long local_28;
  uint64_t dbl;
  uint64_t kMantissaMask;
  bool sign_local;
  mantissa_t mStack_10;
  int exponent_local;
  mantissa_t mantissa_local;
  
  dbl = 0xfffffffffffff;
  local_28 = (ulong)sign << 0x3f;
  kMantissaMask._3_1_ = sign;
  kMantissaMask._4_4_ = exponent;
  if (mantissa < 0x10000000000000) {
    mStack_10 = mantissa;
    if (exponent != -0x432) {
      __assert_fail("exponent == kMinNormalExponent",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/charconv.cc"
                    ,0xaa,
                    "static double absl::lts_20250127::(anonymous namespace)::FloatTraits<double>::Make(mantissa_t, int, bool)"
                   );
    }
  }
  else {
    local_28 = ((long)(exponent + 0x433) << 0x34) + local_28;
    mStack_10 = mantissa & 0xfffffffffffff;
  }
  local_28 = mStack_10 + local_28;
  dVar1 = bit_cast<double,_unsigned_long,_0>(&local_28);
  return dVar1;
}

Assistant:

static double Make(mantissa_t mantissa, int exponent, bool sign) {
#ifndef ABSL_BIT_PACK_FLOATS
    // Support ldexp no matter which namespace it's in.  Some platforms
    // incorrectly don't put it in namespace std.
    using namespace std;  // NOLINT
    return sign ? -ldexp(mantissa, exponent) : ldexp(mantissa, exponent);
#else
    constexpr uint64_t kMantissaMask =
        (uint64_t{1} << (kTargetMantissaBits - 1)) - 1;
    uint64_t dbl = static_cast<uint64_t>(sign) << 63;
    if (mantissa > kMantissaMask) {
      // Normal value.
      // Adjust by 1023 for the exponent representation bias, and an additional
      // 52 due to the implied decimal point in the IEEE mantissa
      // representation.
      dbl += static_cast<uint64_t>(exponent + 1023 + kTargetMantissaBits - 1)
             << 52;
      mantissa &= kMantissaMask;
    } else {
      // subnormal value
      assert(exponent == kMinNormalExponent);
    }
    dbl += mantissa;
    return absl::bit_cast<double>(dbl);
#endif  // ABSL_BIT_PACK_FLOATS
  }